

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_equalp_bound(sexp ctx,sexp self,sexp_sint_t n,sexp a,sexp b,sexp depth,sexp bound)

{
  void *__s2;
  uint uVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  sexp_sint_t sVar5;
  size_t __n;
  void *__s1;
  anon_union_24768_35_b8e82fc1_for_value *paVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  
  while( true ) {
    if (a == b) {
      return bound;
    }
    if (((a == (sexp)0x0) || (b == (sexp)0x0)) || ((((uint)a | (uint)b) & 3) != 0)) break;
    uVar1 = a->tag;
    if (uVar1 != b->tag) break;
    if ((ulong)uVar1 == 0xb) {
      bVar11 = (a->value).type.name == (b->value).type.name;
LAB_001100f9:
      if (bVar11) {
        return bound;
      }
      return (sexp)&DAT_0000003e;
    }
    if (uVar1 == 0xc) {
      sVar5 = sexp_bignum_compare(a,b);
      bVar11 = sVar5 == 0;
      goto LAB_001100f9;
    }
    if ((long)depth < 0) {
      return bound;
    }
    if ((long)bound < 0) {
      return bound;
    }
    lVar9 = *(long *)((long)&((((ctx->value).type.setters)->value).type.getters)->value +
                     (ulong)uVar1 * 8 + 8);
    lVar7 = (long)*(short *)(lVar9 + 0x54);
    lVar8 = lVar7;
    if (lVar7 == 0) {
      lVar8 = 8;
    }
    paVar6 = (anon_union_24768_35_b8e82fc1_for_value *)((long)&b->tag + lVar7);
    if (lVar7 == 0) {
      paVar6 = &b->value;
    }
    if ((lVar8 != 8) && (iVar4 = bcmp(&a->value,&b->value,lVar8 - 8), iVar4 != 0)) break;
    lVar7 = *(long *)((long)&a->tag + (long)*(short *)(lVar9 + 0x5a)) *
            (ulong)*(ushort *)(lVar9 + 0x5c);
    __s1 = (void *)((long)&a->tag + (*(short *)(lVar9 + 0x58) + lVar7) * 8 + lVar8);
    __n = (long)a + ((*(long *)((long)&a->tag + (long)*(short *)(lVar9 + 0x60)) *
                      (ulong)*(ushort *)(lVar9 + 0x62) + (long)*(short *)(lVar9 + 0x5e)) -
                    (long)__s1);
    if ((__n != 0) &&
       ((__s2 = (void *)((long)paVar6 +
                        ((ulong)*(ushort *)(lVar9 + 0x5c) *
                         *(long *)((long)&b->tag + (long)*(short *)(lVar9 + 0x5a)) +
                        (long)*(short *)(lVar9 + 0x58)) * 8),
        __n != (long)b + (((ulong)*(ushort *)(lVar9 + 0x62) *
                           *(long *)((long)&b->tag + (long)*(short *)(lVar9 + 0x60)) +
                          (long)*(short *)(lVar9 + 0x5e)) - (long)__s2) ||
        (iVar4 = bcmp(__s1,__s2,__n), iVar4 != 0)))) break;
    bound = (sexp)((long)&bound[-1].value + 0x60be);
    lVar7 = lVar7 + *(short *)(lVar9 + 0x56);
    if (lVar7 < 1) {
      return bound;
    }
    do {
      lVar9 = lVar7;
      if (lVar9 < 2) {
        lVar7 = 1;
        goto LAB_0011006e;
      }
      piVar2 = *(int **)((long)a + lVar9 * 8 + lVar8 + -8);
      piVar3 = *(int **)((long)paVar6 + lVar9 * 8 + -8);
      lVar7 = lVar9 + -1;
    } while (piVar2 == piVar3);
    if ((((piVar2 == (int *)0x0) || (piVar3 == (int *)0x0)) ||
        ((((uint)piVar3 | (uint)piVar2) & 3) != 0)) || (lVar7 = lVar9, *piVar2 != *piVar3)) break;
LAB_0011006e:
    if (lVar9 < 2) {
      lVar9 = 1;
    }
    lVar10 = 0;
    while (lVar9 + -1 != lVar10) {
      bound = sexp_equalp_bound(ctx,self,n,*(sexp *)((long)&a->tag + lVar10 * 8 + lVar8),
                                *(sexp *)((long)paVar6 + lVar10 * 8),
                                (sexp)((long)&depth[-1].value + 0x60be),bound);
      lVar10 = lVar10 + 1;
      if (bound == (sexp)&DAT_0000003e) goto LAB_001100cc;
    }
    a = *(sexp *)((long)a + lVar7 * 8 + lVar8 + -8);
    b = *(sexp *)((long)paVar6 + lVar7 * 8 + -8);
  }
LAB_001100cc:
  return (sexp)&DAT_0000003e;
}

Assistant:

sexp sexp_equalp_bound (sexp ctx, sexp self, sexp_sint_t n, sexp a, sexp b, sexp depth, sexp bound) {
  sexp_uint_t left_size, right_size;
  sexp_sint_t i, len;
  sexp t, *p, *q, depth2;
  char *p_left, *p_right, *q_left, *q_right;

 loop:
  if (a == b)
    return bound;
  else if ((!a || !sexp_pointerp(a)) || (!b || !sexp_pointerp(b))
           || (sexp_pointer_tag(a) != sexp_pointer_tag(b)))
    return SEXP_FALSE;

  /* a and b are both pointers of the same type */
#if SEXP_USE_BIGNUMS
  if (sexp_pointer_tag(a) == SEXP_BIGNUM)
    return !sexp_bignum_compare(a, b) ? bound : SEXP_FALSE;
#endif
#if SEXP_USE_FLONUMS && ! SEXP_USE_IMMEDIATE_FLONUMS
  if (sexp_pointer_tag(a) == SEXP_FLONUM)
    return sexp_flonum_eqv(a, b) ? bound : SEXP_FALSE;
#endif
  /* check limits */
  if (sexp_unbox_fixnum(bound) < 0 || sexp_unbox_fixnum(depth) < 0)
    return bound;
  depth2 = sexp_fx_sub(depth, SEXP_ONE);
  bound = sexp_fx_sub(bound, SEXP_ONE);
  t = sexp_object_type(ctx, a);
  p_left = ((char*)a) + offsetof(struct sexp_struct, value);
  p = (sexp*) (((char*)a) + sexp_type_field_base(t));
  q_left = ((char*)b) + offsetof(struct sexp_struct, value);
  q = (sexp*) (((char*)b) + sexp_type_field_base(t));
  /* if no fields, the base is value (just past the header) */
  if ((sexp)p == a) {p=(sexp*)p_left; q=(sexp*)q_left;}
  /* check preliminary non-object data */
  left_size = (char*)p - p_left;
  if ((left_size > 0) && memcmp(p_left, q_left, left_size))
    return SEXP_FALSE;
  /* check trailing non-object data */
  p_right = ((char*)p + sexp_type_num_slots_of_object(t,a)*sizeof(sexp));
  right_size = ((char*)a + sexp_type_size_of_object(t, a)) - p_right;
  if (right_size > 0) {
    q_right = ((char*)q + sexp_type_num_slots_of_object(t,b)*sizeof(sexp));
    if (right_size != ((char*)b + sexp_type_size_of_object(t, b)) - q_right)
      return SEXP_FALSE;
    if (memcmp(p_right, q_right, right_size))
      return SEXP_FALSE;
  }
  /* left and right non-object data is the same, now check eq-object slots */
  len = sexp_type_num_eq_slots_of_object(t, a);
  if (len > 0) {
    for (; len > 1; len--) {
      a = p[len-1]; b = q[len-1];
      if (a != b) {
        if ((!a || !sexp_pointerp(a)) || (!b || !sexp_pointerp(b))
            || (sexp_pointer_tag(a) != sexp_pointer_tag(b)))
          return SEXP_FALSE;
        else break;
      }
    }
    for (i=0; i<len-1; i++) {
      bound = sexp_equalp_bound(ctx, self, n, p[i], q[i], depth2, bound);
      if (sexp_not(bound)) return SEXP_FALSE;
    }
    /* tail-recurse on the last value (same depth) */
    a = p[len-1]; b = q[len-1]; goto loop;
  }
  return bound;
}